

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

QPointer<QHttp2Stream> __thiscall
QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
          (QHash<unsigned_int,_QPointer<QHttp2Stream>_> *this,uint *key)

{
  Data *pDVar1;
  Node<unsigned_int,_QPointer<QHttp2Stream>_> *pNVar2;
  QPointer<QHttp2Stream> *pQVar3;
  QObject *in_RDX;
  QObject *extraout_RDX;
  QPointer<QHttp2Stream> QVar4;
  
  if (*(Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> **)key !=
      (Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_>::
             findNode<unsigned_int>
                       (*(Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> **)key,
                        (uint *)in_RDX);
    in_RDX = extraout_RDX;
    if (pNVar2 != (Node<unsigned_int,_QPointer<QHttp2Stream>_> *)0x0) {
      pQVar3 = &pNVar2->value;
      goto LAB_001f0093;
    }
  }
  pQVar3 = (QPointer<QHttp2Stream> *)0x0;
LAB_001f0093:
  if (pQVar3 == (QPointer<QHttp2Stream> *)0x0) {
    this->d = (Data *)0x0;
    this[1].d = (Data *)0x0;
  }
  else {
    pDVar1 = (Data *)(pQVar3->wp).d;
    this->d = pDVar1;
    this[1].d = (Data *)(pQVar3->wp).value;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar4.wp.value = in_RDX;
  QVar4.wp.d = (Data *)this;
  return (QPointer<QHttp2Stream>)QVar4.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }